

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

chunk * cave_generate(player *p,wchar_t height,wchar_t width)

{
  undefined2 uVar1;
  quest *pqVar2;
  _Bool _Var3;
  int iVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  uint32_t y;
  dun_data *pdVar7;
  chunk_conflict2 *pcVar8;
  object **ppoVar9;
  ulong uVar10;
  loc *plVar11;
  int *piVar12;
  loc **pplVar13;
  level *plVar14;
  chunk_conflict *pcVar15;
  cave_profile *pcVar16;
  loc lVar17;
  square *psVar18;
  connector *pcVar19;
  feature *pfVar20;
  bitflag *pbVar21;
  connector *pcVar22;
  char cVar23;
  byte bVar24;
  uint uVar25;
  long lVar26;
  char *pcVar27;
  dun_data *dd;
  wchar_t wVar28;
  cave_profile *pcVar29;
  char *error;
  loc grid;
  dun_data dun_body;
  char *local_128;
  wchar_t local_11c;
  wchar_t local_118;
  uint local_114;
  player *local_110;
  loc_conflict local_108;
  undefined6 uStack_100;
  undefined2 uStack_fa;
  undefined6 uStack_f8;
  undefined8 uStack_f2;
  dun_data local_e0;
  
  local_128 = "no generation";
  if (p->upkeep->arena_level == false) {
    uVar25 = 0;
    local_11c = height;
    local_118 = width;
    local_110 = p;
    do {
      local_128 = (char *)0x0;
      character_dungeon = false;
      dun = &local_e0;
      local_114 = uVar25;
      plVar11 = (loc *)mem_zalloc((ulong)z_info->level_room_max << 3);
      dun->cent = plVar11;
      piVar12 = (int *)mem_zalloc((ulong)z_info->level_room_max << 2);
      dun->ent_n = piVar12;
      pplVar13 = (loc **)mem_zalloc((ulong)z_info->level_room_max << 3);
      pdVar7 = dun;
      dun->ent = pplVar13;
      pdVar7->ent2room = (int **)0x0;
      plVar11 = (loc *)mem_zalloc((ulong)z_info->level_door_max << 3);
      dun->door = plVar11;
      plVar11 = (loc *)mem_zalloc((ulong)z_info->wall_pierce_max << 3);
      dun->wall = plVar11;
      plVar11 = (loc *)mem_zalloc((ulong)z_info->tunn_grid_max << 3);
      pdVar7 = dun;
      dun->tunn = plVar11;
      pdVar7->one_off_below = (connector *)0x0;
      pdVar7->curr_join = (connector *)0x0;
      pdVar7->join = (connector *)0x0;
      pdVar7->one_off_above = (connector *)0x0;
      pdVar7->nstair_room = L'\0';
      _Var3 = is_quest(p,(int)p->depth);
      pdVar7 = dun;
      dun->quest = _Var3;
      if ((p->opts).opt[0x2b] == true) {
        pdVar7->persist = true;
        plVar14 = level_by_depth(p->depth + L'\xffffffff');
        if (plVar14 == (level *)0x0) {
          pcVar15 = (chunk_conflict *)0x0;
        }
        else {
          pcVar15 = chunk_find_name(plVar14->name);
        }
        if (pcVar15 == (chunk_conflict *)0x0) {
          plVar14 = level_by_depth(p->depth + L'\xfffffffe');
          if (plVar14 == (level *)0x0) {
            pcVar15 = (chunk_conflict *)0x0;
          }
          else {
            pcVar15 = chunk_find_name(plVar14->name);
          }
          if (pcVar15 != (chunk_conflict *)0x0) {
            for (pcVar19 = pcVar15->join; pcVar19 != (connector *)0x0; pcVar19 = pcVar19->next) {
              if (pcVar19->feat == '\x06') {
                pcVar22 = (connector *)mem_zalloc(0x20);
                pcVar22->grid = pcVar19->grid;
                pcVar22->feat = '\x06';
                pcVar22->next = pdVar7->one_off_above;
                pdVar7->one_off_above = pcVar22;
              }
            }
          }
        }
        else {
          for (pcVar19 = pcVar15->join; pcVar19 != (connector *)0x0; pcVar19 = pcVar19->next) {
            if (pcVar19->feat == '\x06') {
              pcVar22 = (connector *)mem_zalloc(0x20);
              (pcVar22->grid).y = (pcVar19->grid).y;
              (pcVar22->grid).x = (pcVar19->grid).x;
              pcVar22->feat = '\x05';
              pcVar22->next = pdVar7->join;
              pdVar7->join = pcVar22;
            }
          }
        }
        plVar14 = level_by_depth(p->depth + L'\x01');
        if (plVar14 == (level *)0x0) {
          pcVar15 = (chunk_conflict *)0x0;
        }
        else {
          pcVar15 = chunk_find_name(plVar14->name);
        }
        if (pcVar15 == (chunk_conflict *)0x0) {
          plVar14 = level_by_depth(p->depth + L'\x02');
          if (plVar14 == (level *)0x0) {
            pcVar15 = (chunk_conflict *)0x0;
          }
          else {
            pcVar15 = chunk_find_name(plVar14->name);
          }
          if (pcVar15 != (chunk_conflict *)0x0) {
            for (pcVar19 = pcVar15->join; pcVar19 != (connector *)0x0; pcVar19 = pcVar19->next) {
              if (pcVar19->feat == '\x05') {
                pcVar22 = (connector *)mem_zalloc(0x20);
                pcVar22->grid = pcVar19->grid;
                pcVar22->feat = '\x05';
                pcVar22->next = pdVar7->one_off_below;
                pdVar7->one_off_below = pcVar22;
              }
            }
          }
        }
        else {
          for (pcVar19 = pcVar15->join; pcVar19 != (connector *)0x0; pcVar19 = pcVar19->next) {
            if (pcVar19->feat == '\x05') {
              pcVar22 = (connector *)mem_zalloc(0x20);
              (pcVar22->grid).y = (pcVar19->grid).y;
              (pcVar22->grid).x = (pcVar19->grid).x;
              pcVar22->feat = '\x06';
              pcVar22->next = pdVar7->join;
              pdVar7->join = pcVar22;
            }
          }
        }
      }
      else {
        pdVar7->persist = false;
      }
      pcVar16 = find_cave_profile("moria");
      wVar6 = pcVar16->alloc;
      pcVar16 = find_cave_profile("labyrinth");
      wVar28 = pcVar16->alloc;
      if ((p->noscore & 0x10) == 0) {
        pcVar16 = (cave_profile *)0x0;
LAB_00158738:
        pcVar27 = "town";
        if (p->depth == L'\0') {
LAB_001588b3:
          pcVar16 = find_cave_profile(pcVar27);
        }
        else {
          _Var3 = is_quest(p,(int)p->depth);
          pcVar27 = "classic";
          if (((_Var3) ||
              (((iVar4 = (int)p->depth, 0xc < iVar4 &&
                (uVar5 = Rand_div(100), height = local_11c,
                (int)uVar5 <
                (int)((uint)((uint)(iVar4 * -0x45d1745d) < 0x1745d175) +
                      (uint)((uint)(iVar4 * -0x33333333) < 0x33333334) +
                      (uint)((uint)(iVar4 * -0x55555555) < 0x55555556) +
                      (uint)((uint)(iVar4 * -0x49249249) < 0x24924925) +
                      (uint)((uint)(iVar4 * -0x3b13b13b) < 0x13b13b14) + 2))) &&
               (pcVar27 = "labyrinth", wVar28 == L'\xffffffff' || L'\0' < wVar28)))) ||
             (((uVar1 = p->depth, (ushort)(uVar1 - 10) < 0x1e &&
               (uVar5 = Rand_div(0x28), uVar5 == 0)) &&
              (pcVar27 = "moria", wVar6 == L'\xffffffff' || L'\0' < wVar6)))) goto LAB_001588b3;
          if (z_info->profile_max != 0) {
            lVar26 = 0;
            uVar10 = 0;
            uVar5 = 0;
            do {
              iVar4 = *(int *)((long)&cave_profiles->alloc + lVar26);
              if ((0 < iVar4) &&
                 (*(int *)((long)&cave_profiles->min_level + lVar26) <= (int)local_110->depth)) {
                pcVar29 = (cave_profile *)((long)&cave_profiles->next + lVar26);
                uVar5 = uVar5 + iVar4;
                wVar6 = Rand_div(uVar5);
                if (wVar6 < pcVar29->alloc) {
                  pcVar16 = pcVar29;
                }
              }
              uVar10 = uVar10 + 1;
              lVar26 = lVar26 + 0x80;
            } while (uVar10 < z_info->profile_max);
          }
          pcVar27 = "classic";
          p = local_110;
          height = local_11c;
          width = local_118;
          if (pcVar16 == (cave_profile *)0x0) goto LAB_001588b3;
        }
        if (pcVar16 == (cave_profile *)0x0) {
          quit("Failed to find cave profile!");
          pcVar16 = (cave_profile *)0x0;
        }
      }
      else {
        uStack_f8 = 0;
        uStack_f2 = 0;
        local_108.x = 0;
        local_108.y = 0;
        uStack_100 = 0;
        uStack_fa = 0;
        p->noscore = p->noscore & 0xffef;
        _Var3 = get_string("Profile name (eg classic): ",(char *)&local_108,0x1e);
        if (_Var3) {
          pcVar16 = find_cave_profile((char *)&local_108);
        }
        else {
          pcVar16 = (cave_profile *)0x0;
        }
        if (pcVar16 == (cave_profile *)0x0) goto LAB_00158738;
      }
      dun->profile = pcVar16;
      event_signal_string(EVENT_GEN_LEVEL_START,dun->profile->name);
      pcVar27 = (char *)p;
      pdVar7 = (dun_data *)(*dun->profile->builder)(p,height,width,&local_128);
      uVar25 = local_114;
      if (pdVar7 == (dun_data *)0x0) {
        if (local_128 == (char *)0x0) {
          local_128 = "unspecified level builder failure";
        }
        if ((p->opts).opt[0x18] == true) {
          pcVar27 = "Generation restarted: %s.";
          msg("Generation restarted: %s.");
        }
        cleanup_dun_data((dun_data *)pcVar27);
        event_signal_flag(EVENT_GEN_LEVEL_END,false);
      }
      else {
        if ((dun->quest == true) && (z_info->quest_max != 0)) {
          uVar10 = 0;
          do {
            pqVar2 = player->quests;
            if (*(wchar_t *)&pdVar7->field_0xc == (uint)pqVar2[uVar10].level) {
              _Var3 = flag_has_dbg((pqVar2[uVar10].race)->flags,0xb,1,"q->race->flags","RF_UNIQUE");
              if (((!_Var3) || ((pqVar2[uVar10].race)->cur_num < L'\x01')) &&
                 (L'\0' < pqVar2[uVar10].max_num)) {
                wVar6 = L'\0';
                do {
                  find_empty((chunk_conflict *)pdVar7,&local_108);
                  place_new_monster((chunk *)pdVar7,local_108,pqVar2[uVar10].race,true,true,
                                    (monster_group_info)0x0,'\n');
                  wVar6 = wVar6 + L'\x01';
                } while (wVar6 < pqVar2[uVar10].max_num);
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < z_info->quest_max);
        }
        if (L'\0' < *(wchar_t *)&pdVar7->ent) {
          wVar6 = L'\0';
          do {
            if (L'\0' < *(wchar_t *)((long)&pdVar7->ent + 4)) {
              wVar28 = L'\0';
              do {
                lVar17 = (loc)loc(wVar28,wVar6);
                psVar18 = square((chunk_conflict *)pdVar7,lVar17);
                flag_off(psVar18->info,3,0xb);
                psVar18 = square((chunk_conflict *)pdVar7,lVar17);
                flag_off(psVar18->info,3,0xc);
                psVar18 = square((chunk_conflict *)pdVar7,lVar17);
                flag_off(psVar18->info,3,0xd);
                psVar18 = square((chunk_conflict *)pdVar7,lVar17);
                flag_off(psVar18->info,3,0xe);
                _Var3 = square_isstairs((chunk_conflict *)pdVar7,lVar17);
                if (_Var3) {
                  pcVar19 = (connector *)mem_zalloc(0x20);
                  pcVar19->grid = lVar17;
                  pfVar20 = square_feat((chunk_conflict *)pdVar7,lVar17);
                  pcVar19->feat = (uint8_t)pfVar20->fidx;
                  pbVar21 = (bitflag *)mem_zalloc(3);
                  pcVar19->info = pbVar21;
                  lVar26 = 0;
                  do {
                    psVar18 = square((chunk_conflict *)pdVar7,lVar17);
                    pcVar19->info[lVar26] = psVar18->info[lVar26];
                    lVar26 = lVar26 + 1;
                  } while (lVar26 != 3);
                  pcVar19->next = pdVar7->join;
                  pdVar7->join = pcVar19;
                }
                wVar28 = wVar28 + L'\x01';
              } while (wVar28 < *(wchar_t *)((long)&pdVar7->ent + 4));
            }
            wVar6 = wVar6 + L'\x01';
          } while (wVar6 < *(wchar_t *)&pdVar7->ent);
        }
        dd = pdVar7;
        wVar6 = cave_monster_max((chunk_conflict *)pdVar7);
        p = local_110;
        uVar25 = local_114;
        width = local_118;
        height = local_11c;
        if ((int)(uint)z_info->level_monster_max <= wVar6) {
          local_128 = "too many monsters";
        }
        if (local_128 != (char *)0x0) {
          if ((local_110->opts).opt[0x18] == true) {
            msg("Generation restarted: %s.");
          }
          uncreate_artifacts((chunk_conflict *)pdVar7);
          wipe_mon_list((chunk *)pdVar7,p);
          cave_free((chunk_conflict *)pdVar7);
          dd = (dun_data *)0x3a;
          event_signal_flag(EVENT_GEN_LEVEL_END,false);
        }
        cleanup_dun_data(dd);
      }
    } while ((uVar25 < 99) && (uVar25 = uVar25 + 1, local_128 != (char *)0x0));
    if (local_128 != (char *)0x0) {
      quit_fmt("cave_generate() failed 100 times!");
    }
    if (p->depth != 0) {
      if (z_info->feeling_total != 0) {
        uVar25 = 0;
        do {
          iVar4 = 500;
          do {
            uVar5 = Rand_div(*(wchar_t *)((long)&pdVar7->ent + 4));
            y = Rand_div(*(wchar_t *)&pdVar7->ent);
            lVar17 = (loc)loc(uVar5,y);
            _Var3 = square_allowsfeel((chunk_conflict *)pdVar7,lVar17);
            if ((_Var3) && (_Var3 = square_isfeel((chunk_conflict *)pdVar7,lVar17), !_Var3)) {
              psVar18 = square((chunk_conflict *)pdVar7,lVar17);
              flag_on_dbg(psVar18->info,3,8,"square(c, grid)->info","SQUARE_FEEL");
              break;
            }
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          uVar25 = uVar25 + 1;
        } while (uVar25 < z_info->feeling_total);
      }
      *(uint16_t *)&pdVar7->ent2room = 0;
      p = local_110;
    }
    wVar6 = *(wchar_t *)&pdVar7->field_0xc;
    if (wVar6 == L'\0') {
      cVar23 = '\0';
    }
    else {
      _Var3 = *(_Bool *)((long)&pdVar7->ent_n + 4);
      if ((_Var3 != true) || (cVar23 = '\n', (p->opts).opt[0x24] == false)) {
        uVar25 = *(uint32_t *)((long)&pdVar7->cent + 4) / (uint)wVar6;
        cVar23 = '<';
        if ((((_Var3 & uVar25 < 0x281) == 0) &&
            ((((cVar23 = '\x14', uVar25 < 0x27101 && (cVar23 = '\x1e', uVar25 < 0x9c41)) &&
              (cVar23 = '(', uVar25 < 0x2711)) &&
             ((cVar23 = '2', uVar25 < 0x9c5 && (cVar23 = '<', uVar25 < 0x281)))))) &&
           ((cVar23 = 'F', uVar25 < 0xa1 && (cVar23 = 'P', uVar25 < 0x29)))) {
          cVar23 = 'd';
          if (10 < uVar25) {
            cVar23 = 'Z';
          }
        }
      }
    }
    if (wVar6 == L'\0') {
      bVar24 = 0;
    }
    else {
      uVar25 = *(uint *)&pdVar7->ent_n / (uint)wVar6;
      bVar24 = 1;
      if ((((uVar25 < 0x1b59) && (bVar24 = 2, uVar25 < 0x1195)) &&
          ((bVar24 = 3, uVar25 < 0x9c5 &&
           (((bVar24 = 4, uVar25 < 0x5dd && (bVar24 = 5, uVar25 < 0x321)) &&
            (bVar24 = 6, uVar25 < 0x191)))))) && (bVar24 = 7, uVar25 < 0x97)) {
        bVar24 = 0x32 < uVar25 ^ 9;
      }
    }
    *(byte *)&pdVar7->cent = bVar24 + cVar23;
    chunk_validate_objects((chunk_conflict *)pdVar7);
    pcVar8 = (chunk_conflict2 *)
             cave_new(*(wchar_t *)&pdVar7->ent,*(wchar_t *)((long)&pdVar7->ent + 4));
    p->cave = pcVar8;
    pcVar8->depth = *(wchar_t *)&pdVar7->field_0xc;
    ppoVar9 = (object **)mem_realloc(pcVar8->objects,(ulong)(ushort)pdVar7->block_hgt * 8 + 8);
    pcVar8 = p->cave;
    pcVar8->objects = ppoVar9;
    pcVar8->obj_max = (uint16_t)pdVar7->block_hgt;
    uVar10 = 0xffffffffffffffff;
    do {
      pcVar8->objects[uVar10 + 1] = (object *)0x0;
      pcVar8 = p->cave;
      uVar10 = uVar10 + 1;
    } while (uVar10 < pcVar8->obj_max);
    if (p->upkeep->light_level == true) {
      wiz_light((chunk *)pdVar7,p,false);
      p->upkeep->light_level = false;
    }
  }
  else {
    event_signal_string(EVENT_GEN_LEVEL_START,"arena");
    pdVar7 = (dun_data *)arena_gen(p,height,width);
    pcVar8 = (chunk_conflict2 *)
             cave_new(*(wchar_t *)&pdVar7->ent,*(wchar_t *)((long)&pdVar7->ent + 4));
    p->cave = pcVar8;
    pcVar8->depth = *(wchar_t *)&pdVar7->field_0xc;
    ppoVar9 = (object **)mem_realloc(pcVar8->objects,(ulong)(ushort)pdVar7->block_hgt * 8 + 8);
    pcVar8 = p->cave;
    pcVar8->objects = ppoVar9;
    pcVar8->obj_max = (uint16_t)pdVar7->block_hgt;
    uVar10 = 0xffffffffffffffff;
    do {
      pcVar8->objects[uVar10 + 1] = (object *)0x0;
      pcVar8 = p->cave;
      uVar10 = uVar10 + 1;
    } while (uVar10 < pcVar8->obj_max);
    wiz_light((chunk *)pdVar7,p,false);
  }
  pdVar7->cent_n = turn;
  return (chunk *)pdVar7;
}

Assistant:

static struct chunk *cave_generate(struct player *p, int height, int width)
{
	const char *error = "no generation";
	int i, tries = 0;
	struct chunk *chunk = NULL;

	/* Arena levels handled separately */
	if (p->upkeep->arena_level) {
		/* Generate level */
		event_signal_string(EVENT_GEN_LEVEL_START, "arena");
		chunk = arena_gen(p, height, width);

		/* Allocate new known level, light it if requested */
		p->cave = cave_new(chunk->height, chunk->width);
		p->cave->depth = chunk->depth;
		p->cave->objects = mem_realloc(p->cave->objects, (chunk->obj_max + 1)
									   * sizeof(struct object*));
		p->cave->obj_max = chunk->obj_max;
		for (i = 0; i <= p->cave->obj_max; i++) {
			p->cave->objects[i] = NULL;
		}

		wiz_light(chunk, p, false);
		chunk->turn = turn;

		return chunk;
	}

	/* Generate */
	for (tries = 0; tries < 100 && error; tries++) {
		int y, x;
		struct dun_data dun_body;

		error = NULL;

		/* Mark the dungeon as being unready (to avoid artifact loss, etc) */
		character_dungeon = false;

		/* Allocate global data (will be freed when we leave the loop) */
		dun = &dun_body;
		dun->cent = mem_zalloc(z_info->level_room_max * sizeof(struct loc));
		dun->ent_n = mem_zalloc(z_info->level_room_max * sizeof(*dun->ent_n));
		dun->ent = mem_zalloc(z_info->level_room_max * sizeof(*dun->ent));
		dun->ent2room = NULL;
		dun->door = mem_zalloc(z_info->level_door_max * sizeof(struct loc));
		dun->wall = mem_zalloc(z_info->wall_pierce_max * sizeof(struct loc));
		dun->tunn = mem_zalloc(z_info->tunn_grid_max * sizeof(struct loc));
		dun->join = NULL;
		dun->one_off_above = NULL;
		dun->one_off_below = NULL;
		dun->curr_join = NULL;
		dun->nstair_room = 0;
		dun->quest = is_quest(p, p->depth);

		/* Get connector info for persistent levels */
		if (OPT(p, birth_levels_persist)) {
			dun->persist = true;
			get_join_info(p, dun);
		} else {
			dun->persist = false;
		}


		/* Choose a profile and build the level */
		dun->profile = choose_profile(p);
		event_signal_string(EVENT_GEN_LEVEL_START, dun->profile->name);
		chunk = dun->profile->builder(p, height, width, &error);
		if (!chunk) {
			if (!error) {
				error = "unspecified level builder failure";
			}
			if (OPT(p, cheat_room)) {
				msg("Generation restarted: %s.", error);
			}
			cleanup_dun_data(dun);
			event_signal_flag(EVENT_GEN_LEVEL_END, false);
			continue;
		}

		/* Ensure quest monsters */
		if (dun->quest) {
			for (i = 0; i < z_info->quest_max; i++) {
				struct quest *q = &player->quests[i];
				struct monster_group_info info = { 0, 0 };
				struct loc grid;

				if (q->level != chunk->depth) continue;

				/* If the quest monster is unique and has already been placed, don't place again */
				if (rf_has(q->race->flags, RF_UNIQUE) && q->race->cur_num > 0) continue;

				/* Pick a location and place the monster(s) */
				for (int n = 0; n < q->max_num; n++) {
					find_empty(chunk, &grid);
					place_new_monster(chunk, grid, q->race, true, true, info,
									  ORIGIN_DROP);
				}
			}
		}

		/* Clear generation flags, add connecting info */
		for (y = 0; y < chunk->height; y++) {
			for (x = 0; x < chunk->width; x++) {
				struct loc grid = loc(x, y);

				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_INNER);
				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_OUTER);
				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_SOLID);
				sqinfo_off(square(chunk, grid)->info, SQUARE_MON_RESTRICT);

				if (square_isstairs(chunk, grid)) {
					size_t n;
					struct connector *new = mem_zalloc(sizeof *new);
					new->grid = grid;
					new->feat = square_feat(chunk, grid)->fidx;
					new->info = mem_zalloc(SQUARE_SIZE * sizeof(bitflag));
					for (n = 0; n < SQUARE_SIZE; n++) {
						new->info[n] = square(chunk, grid)->info[n];
					}
					new->next = chunk->join;
					chunk->join = new;
				}
			}
		}

		/* Regenerate levels that overflow their maxima */
		if (cave_monster_max(chunk) >= z_info->level_monster_max)
			error = "too many monsters";

		if (error) {
			if (OPT(p, cheat_room)) {
				msg("Generation restarted: %s.", error);
			}
			uncreate_artifacts(chunk);
			cave_clear(chunk, p);
			event_signal_flag(EVENT_GEN_LEVEL_END, false);
		}

		cleanup_dun_data(dun);
	}

	if (error) quit_fmt("cave_generate() failed 100 times!");

	/* Place dungeon squares to trigger feeling (not in town) */
	if (p->depth) {
		place_feeling(chunk);
	}

	chunk->feeling = calc_obj_feeling(chunk, p) + calc_mon_feeling(chunk);

	/* Validate the dungeon (we could use more checks here) */
	chunk_validate_objects(chunk);

	/* Allocate new known level, light it if requested */
	p->cave = cave_new(chunk->height, chunk->width);
	p->cave->depth = chunk->depth;
	p->cave->objects = mem_realloc(p->cave->objects, (chunk->obj_max + 1)
								   * sizeof(struct object*));
	p->cave->obj_max = chunk->obj_max;
	for (i = 0; i <= p->cave->obj_max; i++) {
		p->cave->objects[i] = NULL;
	}
	if (p->upkeep->light_level) {
		wiz_light(chunk, p, false);
		p->upkeep->light_level = false;
	}

	chunk->turn = turn;

	return chunk;
}